

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O1

bool __thiscall HighsCutGeneration::separateLiftedMixedBinaryCover(HighsCutGeneration *this)

{
  HighsCDouble *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  pointer piVar1;
  double *pdVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  HighsCDouble HVar17;
  vector<double,_std::allocator<double>_> S;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coverflag;
  vector<double,_std::allocator<double>_> local_98;
  double local_78;
  undefined8 uStack_70;
  long local_60;
  double local_58;
  ulong local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this->integralSupport = false;
  this->integralCoefficients = false;
  uVar8 = (ulong)((long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&local_98,(long)(int)uVar8);
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_48,(long)this->rowlen);
  if ((int)uVar8 == 0) {
    bVar10 = false;
  }
  else {
    uVar6 = 0;
    do {
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start
      [(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[uVar6]] = '\x01';
      uVar6 = uVar6 + 1;
    } while ((uVar8 & 0xffffffff) != uVar6);
    begin._M_current =
         (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start;
    end._M_current =
         (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (begin._M_current != end._M_current) {
      uVar6 = (long)end._M_current - (long)begin._M_current >> 2;
      iVar4 = 0;
      if (1 < uVar6) {
        iVar4 = 0;
        do {
          uVar6 = (long)uVar6 >> 1;
          iVar4 = iVar4 + 1;
        } while (1 < uVar6);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0,true>
                (begin,end,(anon_class_8_1_8991fb9c)this,iVar4,true);
    }
    piVar1 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = this->vals;
    dVar15 = 0.0;
    uVar6 = 0;
    dVar12 = 0.0;
    do {
      dVar13 = pdVar2[piVar1[uVar6]];
      dVar14 = (this->lambda).hi;
      dVar16 = dVar13 - dVar14;
      if ((((dVar13 - (dVar14 + dVar16)) + (-dVar14 - (dVar16 - (dVar14 + dVar16)))) -
          (this->lambda).lo) + dVar16 <= this->epsilon) {
        uVar8 = uVar6 & 0xffffffff;
        break;
      }
      dVar14 = dVar12 + dVar13;
      dVar15 = dVar15 + (dVar12 - (dVar14 - dVar13)) + (dVar13 - (dVar14 - (dVar14 - dVar13)));
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = dVar14 + dVar15;
      uVar6 = uVar6 + 1;
      dVar12 = dVar14;
    } while ((uVar8 & 0xffffffff) != uVar6);
    iVar4 = (int)uVar8;
    bVar10 = iVar4 != 0;
    if (bVar10) {
      uVar3 = *(uint *)((long)&(this->lambda).hi + 4);
      dVar15 = (this->lambda).lo;
      *(undefined4 *)&(this->rhs).hi = *(undefined4 *)&(this->lambda).hi;
      *(uint *)((long)&(this->rhs).hi + 4) = uVar3 ^ 0x80000000;
      *(int *)&(this->rhs).lo = SUB84(dVar15,0);
      *(uint *)((long)&(this->rhs).lo + 4) = (uint)((ulong)dVar15 >> 0x20) ^ 0x80000000;
      this->integralSupport = true;
      this->integralCoefficients = false;
      if (this->rowlen != 0) {
        this_00 = &this->lambda;
        uVar6 = uVar8 & 0xffffffff;
        local_58 = (double)iVar4;
        local_60 = (long)iVar4;
        uVar7 = 0;
        local_50 = uVar8;
        do {
          if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar7] == '\0') {
            pdVar2 = this->vals + uVar7;
            if (0.0 < *pdVar2 || *pdVar2 == 0.0) {
              this->vals[uVar7] = 0.0;
            }
            else {
              this->integralSupport = false;
            }
          }
          else if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar7] == '\0') {
            local_78 = this->vals[uVar7];
            uStack_70 = 0;
            dVar15 = local_78;
            bVar9 = 0 < iVar4;
            if (0 < (int)uVar8) {
              dVar12 = (this->lambda).hi;
              bVar9 = true;
              iVar5 = 0;
              uVar8 = 1;
              do {
                dVar15 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar8 - 1];
                dVar13 = dVar15 - dVar12;
                if (local_78 <=
                    (((dVar15 - (dVar12 + dVar13)) + (-dVar12 - (dVar13 - (dVar12 + dVar13)))) -
                    (this->lambda).lo) + dVar13) {
                  HVar17 = HighsCDouble::operator*(this_00,(double)iVar5);
                  dVar15 = HVar17.hi + HVar17.lo;
                  break;
                }
                if (local_78 <= dVar15) {
                  HVar17 = HighsCDouble::operator*(this_00,(double)(int)uVar8);
                  dVar13 = local_78 -
                           local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar8 - 1];
                  dVar12 = HVar17.hi;
                  dVar15 = dVar12 + dVar13;
                  dVar15 = HVar17.lo +
                           (dVar13 - (dVar15 - dVar12)) + (dVar12 - (dVar15 - (dVar15 - dVar12))) +
                           (-local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar8 - 1] - (dVar13 - local_78)) +
                           (local_78 - (dVar13 - (dVar13 - local_78))) + 0.0 + dVar15;
                  break;
                }
                bVar9 = uVar8 < uVar6;
                iVar5 = iVar5 + 1;
                bVar11 = uVar8 != uVar6;
                uVar8 = uVar8 + 1;
              } while (bVar11);
            }
            if (!bVar9) {
              HVar17 = HighsCDouble::operator*(this_00,local_58);
              dVar13 = local_78 -
                       local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[local_60 + -1];
              dVar12 = HVar17.hi;
              dVar15 = dVar12 + dVar13;
              dVar15 = HVar17.lo +
                       (dVar13 - (dVar15 - dVar12)) + (dVar12 - (dVar15 - (dVar15 - dVar12))) +
                       (-local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[local_60 + -1] - (dVar13 - local_78)) +
                       (local_78 - (dVar13 - (dVar13 - local_78))) + 0.0 + dVar15;
            }
            this->vals[uVar7] = dVar15;
            uVar8 = local_50;
          }
          else {
            dVar12 = (this->lambda).hi + (this->lambda).lo;
            dVar15 = this->vals[uVar7];
            if (dVar15 <= dVar12) {
              dVar12 = dVar15;
            }
            this->vals[uVar7] = dVar12;
            dVar15 = (this->rhs).hi;
            dVar13 = dVar15 + dVar12;
            (this->rhs).hi = dVar13;
            (this->rhs).lo =
                 (dVar15 - (dVar13 - dVar12)) + (dVar12 - (dVar13 - (dVar13 - dVar12))) +
                 (this->rhs).lo;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != (uint)this->rowlen);
      }
    }
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar10;
}

Assistant:

bool HighsCutGeneration::separateLiftedMixedBinaryCover() {
  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  HighsInt coversize = cover.size();
  std::vector<double> S;
  S.resize(coversize);
  std::vector<uint8_t> coverflag;
  coverflag.resize(rowlen);

  if (coversize == 0) return false;

  for (HighsInt i = 0; i != coversize; ++i) coverflag[cover[i]] = 1;

  pdqsort_branchless(cover.begin(), cover.end(),
                     [&](HighsInt a, HighsInt b) { return vals[a] > vals[b]; });
  HighsCDouble sum = 0;

  HighsInt p = coversize;
  for (HighsInt i = 0; i != coversize; ++i) {
    if (vals[cover[i]] - lambda <= epsilon) {
      p = i;
      break;
    }
    sum += vals[cover[i]];
    S[i] = double(sum);
  }
  if (p == 0) return false;
  /* define the lifting function */
  auto phi = [&](double a) {
    for (HighsInt i = 0; i < p; ++i) {
      if (a <= S[i] - lambda) return double(i * lambda);

      if (a <= S[i]) return double((i + 1) * lambda + (HighsCDouble(a) - S[i]));
    }

    return double(p * lambda + (HighsCDouble(a) - S[p - 1]));
  };

  rhs = -lambda;

  integralCoefficients = false;
  integralSupport = true;
  for (HighsInt i = 0; i != rowlen; ++i) {
    if (!isintegral[i]) {
      if (vals[i] < 0)
        integralSupport = false;
      else
        vals[i] = 0;
      continue;
    }

    if (coverflag[i]) {
      vals[i] = std::min(vals[i], double(lambda));
      rhs += vals[i];
    } else {
      vals[i] = phi(vals[i]);
    }
  }

  return true;
}